

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

void If_CluComposeLut(int nVars,If_Grp_t *g,word *t,word (*f) [1024],word *r)

{
  byte bVar1;
  word (*pawVar2) [1024];
  long lVar3;
  int nWords;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  word c [1024];
  ulong local_2038 [1025];
  
  uVar4 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar4 = 1;
  }
  uVar7 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    memset(r,0,uVar7 * 8);
  }
  bVar1 = g->nVars;
  if (bVar1 != 0x1f) {
    uVar6 = 1 << (bVar1 & 0x1f);
    if ((int)uVar6 < 2) {
      uVar6 = 1;
    }
    uVar9 = 0;
    do {
      if ((t[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) {
        if (0 < (int)uVar4) {
          memset(local_2038,0xff,uVar7 * 8);
        }
        if ('\0' < (char)bVar1) {
          lVar3 = 0;
          pawVar2 = f;
          do {
            if (((uint)uVar9 >> ((uint)lVar3 & 0x1f) & 1) == 0) {
              if (0 < (int)uVar4) {
                uVar5 = 0;
                do {
                  local_2038[uVar5] = local_2038[uVar5] & ~(*pawVar2)[uVar5];
                  uVar5 = uVar5 + 1;
                } while (uVar7 != uVar5);
              }
            }
            else if (0 < (int)uVar4) {
              uVar5 = 0;
              do {
                local_2038[uVar5] = local_2038[uVar5] & (*pawVar2)[uVar5];
                uVar5 = uVar5 + 1;
              } while (uVar7 != uVar5);
            }
            lVar3 = lVar3 + 1;
            pawVar2 = pawVar2 + 1;
          } while (lVar3 != (char)bVar1);
        }
        if (0 < (int)uVar4) {
          uVar5 = 0;
          do {
            r[uVar5] = r[uVar5] | local_2038[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
      }
      uVar8 = (uint)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar8 != uVar6);
  }
  return;
}

Assistant:

static void If_CluComposeLut( int nVars, If_Grp_t * g, word * t, word f[6][CLU_WRD_MAX], word * r )
{
    word c[CLU_WRD_MAX];
    int m, v;
    If_CluClear( r, nVars ); 
    for ( m = 0; m < (1<<g->nVars); m++ )
    {
        if ( !((t[m >> 6] >> (m & 63)) & 1) )
            continue;
        If_CluFill( c, nVars );
        for ( v = 0; v < g->nVars; v++ )
            if ( (m >> v) & 1 )
                If_CluAnd( c, c, f[v], nVars );
            else
                If_CluSharp( c, c, f[v], nVars );
        If_CluOr( r, r, c, nVars );
    }
}